

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
          (basic_ifstream<char,_std::char_traits<char>_> *this,path *p,openmode mode)

{
  _Ios_Openmode _Var1;
  string local_40;
  openmode local_1c;
  path *ppStack_18;
  openmode mode_local;
  path *p_local;
  basic_ifstream<char,_std::char_traits<char>_> *this_local;
  
  local_1c = mode;
  ppStack_18 = p;
  p_local = (path *)this;
  std::ios::ios((ios *)&(this->super_basic_ifstream<char,_std::char_traits<char>_>).
                        super_basic_istream<char,_std::char_traits<char>_>.field_0x100);
  filesystem::path::string_abi_cxx11_(&local_40,ppStack_18);
  _Var1 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(this,(char *)&PTR_construction_vtable_24__00363188,_Var1);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_basic_ifstream<char,_std::char_traits<char>_>).
  super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream = (_func_int **)0x363148;
  *(undefined8 *)
   &(this->super_basic_ifstream<char,_std::char_traits<char>_>).
    super_basic_istream<char,_std::char_traits<char>_>.field_0x100 = 0x363170;
  return;
}

Assistant:

explicit basic_ifstream(const path& p, std::ios_base::openmode mode = std::ios_base::in)
        : std::basic_ifstream<charT, traits>(p.string().c_str(), mode)
    {
    }